

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wave.cpp
# Opt level: O2

void __thiscall Wave::print_clusters(Wave *this,ofstream *out,string *filename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  pointer pCVar6;
  int j;
  long lVar7;
  pointer pCVar8;
  long lVar9;
  long lVar10;
  Cluster g;
  Point p;
  vector<double,_std::allocator<double>_> values;
  string filename_gnu;
  string arrow_name;
  ofstream out_gnu;
  ofstream out_arrow;
  
  std::ofstream::ofstream(&out_gnu);
  std::ofstream::ofstream(&out_arrow);
  std::__cxx11::string::rfind((char)filename,0x2e);
  std::__cxx11::string::substr((ulong)&filename_gnu,(ulong)filename);
  std::operator+(&arrow_name,&filename_gnu,"_arrow");
  std::__cxx11::string::~string((string *)&filename_gnu);
  std::__cxx11::string::rfind((char)filename,0x2e);
  std::__cxx11::string::substr((ulong)&g,(ulong)filename);
  std::operator+(&filename_gnu,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,"_gnu.plt")
  ;
  std::__cxx11::string::~string((string *)&g);
  std::ofstream::open((string *)&out_gnu,(_Ios_Openmode)&filename_gnu);
  std::ofstream::open((string *)&out_arrow,(_Ios_Openmode)&arrow_name);
  poVar5 = std::operator<<((ostream *)&out_gnu,"rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 "plot \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 "\' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable, ");
  std::operator<<((ostream *)&out_gnu,(string *)&g);
  std::__cxx11::string::~string((string *)&g);
  std::__cxx11::string::~string((string *)&p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 " \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",&arrow_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 "\' using 1:2:3:4 with vectors head filled  lw 2  lc rgb \"red\"");
  std::operator<<((ostream *)&out_gnu,(string *)&g);
  std::__cxx11::string::~string((string *)&g);
  std::__cxx11::string::~string((string *)&p);
  std::ofstream::open((string *)out,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar5 = std::operator<<((ostream *)&std::cout,"Errors in opening");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    lVar9 = 0;
    lVar7 = 0;
    while( true ) {
      pCVar8 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar6 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((int)(((long)pCVar6 - (long)pCVar8) / 0x18) <= lVar7) break;
      if (10 < (ulong)((*(long *)((long)&(pCVar8->points).
                                         super__Vector_base<Point,_std::allocator<Point>_>._M_impl +
                                 lVar9 + 8) -
                       *(long *)((long)&(pCVar8->points).
                                        super__Vector_base<Point,_std::allocator<Point>_>._M_impl +
                                lVar9)) / 0x18)) {
        std::vector<Point,_std::allocator<Point>_>::vector
                  ((vector<Point,_std::allocator<Point>_> *)&g,
                   (vector<Point,_std::allocator<Point>_> *)
                   ((long)&(pCVar8->points).super__Vector_base<Point,_std::allocator<Point>_>.
                           _M_impl + lVar9));
        Cluster::find_mass_centre(&p,&g);
        Cluster::find_vectors(&values,&g);
        poVar5 = std::ostream::_M_insert<double>(p.x);
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>(p.y);
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>
                           (*values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>
                           (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[1]);
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::ostream::_M_insert<double>(p.x);
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>(p.y);
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>
                           (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[2]);
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>
                           (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[3]);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&values.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                  ((_Vector_base<Point,_std::allocator<Point>_> *)&g);
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x18;
    }
    for (lVar7 = 0; lVar7 < (int)(((long)pCVar6 - (long)pCVar8) / 0x18); lVar7 = lVar7 + 1) {
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      std::vector<Point,_std::allocator<Point>_>::vector
                (&g.points,
                 &(this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7].points);
      lVar10 = 0;
      lVar9 = 0;
      while( true ) {
        if ((int)(((long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18) <= lVar9) break;
        poVar5 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->x + lVar10));
        std::operator<<(poVar5," ");
        poVar5 = std::ostream::_M_insert<double>
                           (*(double *)
                             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->y + lVar10));
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        std::endl<char,std::char_traits<char>>(poVar5);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x18;
      }
      std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                ((_Vector_base<Point,_std::allocator<Point>_> *)&g);
      pCVar8 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar6 = (this->clusters).super__Vector_base<Cluster,_std::allocator<Cluster>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&filename_gnu);
  std::__cxx11::string::~string((string *)&arrow_name);
  std::ofstream::~ofstream(&out_arrow);
  std::ofstream::~ofstream(&out_gnu);
  return;
}

Assistant:

void Wave::print_clusters(ofstream &out,string filename) {
        ofstream out_gnu;
        ofstream out_arrow;
        string arrow_name=filename.substr(0, filename.find_last_of('.')) + "_arrow";
        string filename_gnu = filename.substr(0, filename.find_last_of('.')) + "_gnu.plt";
        out_gnu.open(filename_gnu);
        out_arrow.open(arrow_name);
        out_gnu << "rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)" << endl;

        out_gnu << "plot '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename +
                   "' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable, ";
        out_gnu
                << " '/Users/AlinaArslanova/untitled1/cmake-build-debug/"+arrow_name+"' using 1:2:3:4 with vectors head filled  lw 2  lc rgb \"red\"";
        out.open(filename);
        //log("printing clusters to " + filename);


        int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) clusters.size(); i++) {
            if (clusters[i].points.size() > 10) {

                Cluster g = clusters[i];
                Point p=g.find_mass_centre();
                vector<double> values=g.find_vectors();
                out_arrow << p.x << " " << p.y<< " "<<values[0] << " "<<values[1]<< endl;
                out_arrow << p.x << " " << p.y<< " "<<values[2] << " "<<values[3]<< endl;

            }
        }

        for (int i = 0; i < (int) clusters.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Cluster g = clusters[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c << " " << endl;
            }


        }


    }
    out.close();
    out_arrow.close();
    out_gnu.close();

}